

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3ExprCodeIN(Parse *pParse,Expr *pExpr,int destIfFalse,int destIfNull)

{
  int iVar1;
  Expr *pEVar2;
  CollSeq *zP4;
  bool bVar3;
  int *local_e0;
  int r3;
  CollSeq *pColl_1;
  Expr *p_1;
  Expr *p;
  int op_1;
  int op;
  int ii;
  int regCkNull;
  int regToFree;
  int r2;
  int labelOk;
  CollSeq *pColl;
  ExprList *pList;
  int iStack_70;
  u8 okConstFactor;
  int iTab;
  int addrTop;
  int destNotNull;
  int addrTruthOp;
  int destStep6;
  int destStep2;
  int i;
  Expr *pLeft;
  int iDummy;
  int nVector;
  char *zAff;
  int *aiMap;
  Vdbe *v;
  int rLhsOrig;
  int rLhs;
  int eType;
  int rRhsHasNull;
  int destIfNull_local;
  int destIfFalse_local;
  Expr *pExpr_local;
  Parse *pParse_local;
  
  rLhs = 0;
  zAff = (char *)0x0;
  _iDummy = (char *)0x0;
  destNotNull = 0;
  pList._4_4_ = 0;
  pList._3_1_ = pParse->okConstFactor;
  _destStep2 = pExpr->pLeft;
  eType = destIfNull;
  rRhsHasNull = destIfFalse;
  _destIfNull_local = pExpr;
  pExpr_local = (Expr *)pParse;
  iVar1 = sqlite3ExprCheckIN(pParse,pExpr);
  if (iVar1 != 0) {
    return;
  }
  _iDummy = exprINAffinity((Parse *)pExpr_local,_destIfNull_local);
  pLeft._4_4_ = sqlite3ExprVectorSize(_destIfNull_local->pLeft);
  zAff = (char *)sqlite3DbMallocZero(*(sqlite3 **)pExpr_local,(long)pLeft._4_4_ * 5 + 1);
  if (*(char *)(*(long *)pExpr_local + 0x67) != '\0') goto LAB_0022b252;
  aiMap = (int *)pExpr_local->pLeft;
  if (rRhsHasNull == eType) {
    local_e0 = (int *)0x0;
  }
  else {
    local_e0 = &rLhs;
  }
  rLhsOrig = sqlite3FindInIndex((Parse *)pExpr_local,_destIfNull_local,3,local_e0,(int *)zAff,
                                (int *)((long)&pList + 4));
  *(undefined1 *)((long)&pExpr_local->x + 3) = 0;
  v._0_4_ = exprCodeVector((Parse *)pExpr_local,_destStep2,(int *)&pLeft);
  *(u8 *)((long)&pExpr_local->x + 3) = pList._3_1_;
  destStep6 = 0;
  while( true ) {
    bVar3 = false;
    if (destStep6 < pLeft._4_4_) {
      bVar3 = *(int *)(zAff + (long)destStep6 * 4) == destStep6;
    }
    if (!bVar3) break;
    destStep6 = destStep6 + 1;
  }
  v._4_4_ = (int)v;
  if (destStep6 != pLeft._4_4_) {
    v._4_4_ = sqlite3GetTempRange((Parse *)pExpr_local,pLeft._4_4_);
    for (destStep6 = 0; destStep6 < pLeft._4_4_; destStep6 = destStep6 + 1) {
      sqlite3VdbeAddOp3((Vdbe *)aiMap,0x50,(int)v + destStep6,
                        v._4_4_ + *(int *)(zAff + (long)destStep6 * 4),0);
    }
  }
  if (rLhsOrig == 5) {
    regToFree = sqlite3VdbeMakeLabel((Parse *)pExpr_local);
    op = 0;
    pColl = (CollSeq *)(_destIfNull_local->x).pList;
    _r2 = sqlite3ExprCollSeq((Parse *)pExpr_local,_destIfNull_local->pLeft);
    if (eType != rRhsHasNull) {
      op = sqlite3GetTempReg((Parse *)pExpr_local);
      sqlite3VdbeAddOp3((Vdbe *)aiMap,0x66,v._4_4_,v._4_4_,op);
    }
    for (op_1 = 0; op_1 < *(int *)&pColl->zName; op_1 = op_1 + 1) {
      regCkNull = sqlite3ExprCodeTemp((Parse *)pExpr_local,
                                      *(Expr **)(&pColl->enc + (long)op_1 * 0x18),&ii);
      if ((op != 0) &&
         (iVar1 = sqlite3ExprCanBeNull(*(Expr **)(&pColl->enc + (long)op_1 * 0x18)), iVar1 != 0)) {
        sqlite3VdbeAddOp3((Vdbe *)aiMap,0x66,op,regCkNull,op);
      }
      sqlite3ReleaseTempReg((Parse *)pExpr_local,ii);
      if ((op_1 < *(int *)&pColl->zName + -1) || (eType != rRhsHasNull)) {
        iVar1 = 0x33;
        if (v._4_4_ != regCkNull) {
          iVar1 = 0x35;
        }
        sqlite3VdbeAddOp4((Vdbe *)aiMap,iVar1,v._4_4_,regToFree,regCkNull,(char *)_r2,-2);
        sqlite3VdbeChangeP5((Vdbe *)aiMap,(short)*_iDummy);
      }
      else {
        iVar1 = 0x32;
        if (v._4_4_ != regCkNull) {
          iVar1 = 0x34;
        }
        sqlite3VdbeAddOp4((Vdbe *)aiMap,iVar1,v._4_4_,rRhsHasNull,regCkNull,(char *)_r2,-2);
        sqlite3VdbeChangeP5((Vdbe *)aiMap,(short)*_iDummy | 0x10);
      }
    }
    if (op != 0) {
      sqlite3VdbeAddOp2((Vdbe *)aiMap,0x32,op,eType);
      sqlite3VdbeGoto((Vdbe *)aiMap,rRhsHasNull);
    }
    sqlite3VdbeResolveLabel((Vdbe *)aiMap,regToFree);
    sqlite3ReleaseTempReg((Parse *)pExpr_local,op);
  }
  else {
    if (eType == rRhsHasNull) {
      addrTruthOp = rRhsHasNull;
    }
    else {
      destNotNull = sqlite3VdbeMakeLabel((Parse *)pExpr_local);
      addrTruthOp = destNotNull;
    }
    for (destStep6 = 0; destStep6 < pLeft._4_4_; destStep6 = destStep6 + 1) {
      pEVar2 = sqlite3VectorFieldSubexpr(_destIfNull_local->pLeft,destStep6);
      iVar1._0_2_ = pExpr_local->iColumn;
      iVar1._2_2_ = pExpr_local->iAgg;
      if (iVar1 != 0) goto LAB_0022b252;
      iVar1 = sqlite3ExprCanBeNull(pEVar2);
      if (iVar1 != 0) {
        sqlite3VdbeAddOp2((Vdbe *)aiMap,0x32,v._4_4_ + destStep6,addrTruthOp);
      }
    }
    if (rLhsOrig == 1) {
      sqlite3VdbeAddOp3((Vdbe *)aiMap,0x1e,pList._4_4_,rRhsHasNull,v._4_4_);
      addrTop = sqlite3VdbeAddOp0((Vdbe *)aiMap,9);
    }
    else {
      sqlite3VdbeAddOp4((Vdbe *)aiMap,0x60,v._4_4_,pLeft._4_4_,0,_iDummy,pLeft._4_4_);
      if (rRhsHasNull == eType) {
        sqlite3VdbeAddOp4Int((Vdbe *)aiMap,0x1c,pList._4_4_,rRhsHasNull,v._4_4_,pLeft._4_4_);
        goto LAB_0022b23c;
      }
      addrTop = sqlite3VdbeAddOp4Int((Vdbe *)aiMap,0x1d,pList._4_4_,0,v._4_4_,pLeft._4_4_);
    }
    if ((rLhs != 0) && (pLeft._4_4_ == 1)) {
      sqlite3VdbeAddOp2((Vdbe *)aiMap,0x33,rLhs,rRhsHasNull);
    }
    if (rRhsHasNull == eType) {
      sqlite3VdbeGoto((Vdbe *)aiMap,rRhsHasNull);
    }
    if (destNotNull != 0) {
      sqlite3VdbeResolveLabel((Vdbe *)aiMap,destNotNull);
    }
    iStack_70 = sqlite3VdbeAddOp2((Vdbe *)aiMap,0x24,pList._4_4_,rRhsHasNull);
    if (pLeft._4_4_ < 2) {
      iTab = rRhsHasNull;
    }
    else {
      iTab = sqlite3VdbeMakeLabel((Parse *)pExpr_local);
    }
    for (destStep6 = 0; destStep6 < pLeft._4_4_; destStep6 = destStep6 + 1) {
      iVar1 = sqlite3GetTempReg((Parse *)pExpr_local);
      pEVar2 = sqlite3VectorFieldSubexpr(_destStep2,destStep6);
      zP4 = sqlite3ExprCollSeq((Parse *)pExpr_local,pEVar2);
      sqlite3VdbeAddOp3((Vdbe *)aiMap,0x5e,pList._4_4_,destStep6,iVar1);
      sqlite3VdbeAddOp4((Vdbe *)aiMap,0x34,v._4_4_ + destStep6,iTab,iVar1,(char *)zP4,-2);
      sqlite3ReleaseTempReg((Parse *)pExpr_local,iVar1);
    }
    sqlite3VdbeAddOp2((Vdbe *)aiMap,9,0,eType);
    if (1 < pLeft._4_4_) {
      sqlite3VdbeResolveLabel((Vdbe *)aiMap,iTab);
      sqlite3VdbeAddOp2((Vdbe *)aiMap,0x27,pList._4_4_,iStack_70 + 1);
      sqlite3VdbeAddOp2((Vdbe *)aiMap,9,0,rRhsHasNull);
    }
    sqlite3VdbeJumpHere((Vdbe *)aiMap,addrTop);
  }
LAB_0022b23c:
  if (v._4_4_ != (int)v) {
    sqlite3ReleaseTempReg((Parse *)pExpr_local,v._4_4_);
  }
LAB_0022b252:
  sqlite3DbFree(*(sqlite3 **)pExpr_local,zAff);
  sqlite3DbFree(*(sqlite3 **)pExpr_local,_iDummy);
  return;
}

Assistant:

static void sqlite3ExprCodeIN(
  Parse *pParse,        /* Parsing and code generating context */
  Expr *pExpr,          /* The IN expression */
  int destIfFalse,      /* Jump here if LHS is not contained in the RHS */
  int destIfNull        /* Jump here if the results are unknown due to NULLs */
){
  int rRhsHasNull = 0;  /* Register that is true if RHS contains NULL values */
  int eType;            /* Type of the RHS */
  int rLhs;             /* Register(s) holding the LHS values */
  int rLhsOrig;         /* LHS values prior to reordering by aiMap[] */
  Vdbe *v;              /* Statement under construction */
  int *aiMap = 0;       /* Map from vector field to index column */
  char *zAff = 0;       /* Affinity string for comparisons */
  int nVector;          /* Size of vectors for this IN operator */
  int iDummy;           /* Dummy parameter to exprCodeVector() */
  Expr *pLeft;          /* The LHS of the IN operator */
  int i;                /* loop counter */
  int destStep2;        /* Where to jump when NULLs seen in step 2 */
  int destStep6 = 0;    /* Start of code for Step 6 */
  int addrTruthOp;      /* Address of opcode that determines the IN is true */
  int destNotNull;      /* Jump here if a comparison is not true in step 6 */
  int addrTop;          /* Top of the step-6 loop */
  int iTab = 0;         /* Index to use */
  u8 okConstFactor = pParse->okConstFactor;

  assert( !ExprHasVVAProperty(pExpr,EP_Immutable) );
  pLeft = pExpr->pLeft;
  if( sqlite3ExprCheckIN(pParse, pExpr) ) return;
  zAff = exprINAffinity(pParse, pExpr);
  nVector = sqlite3ExprVectorSize(pExpr->pLeft);
  aiMap = (int*)sqlite3DbMallocZero(
      pParse->db, nVector*(sizeof(int) + sizeof(char)) + 1
  );
  if( pParse->db->mallocFailed ) goto sqlite3ExprCodeIN_oom_error;

  /* Attempt to compute the RHS. After this step, if anything other than
  ** IN_INDEX_NOOP is returned, the table opened with cursor iTab
  ** contains the values that make up the RHS. If IN_INDEX_NOOP is returned,
  ** the RHS has not yet been coded.  */
  v = pParse->pVdbe;
  assert( v!=0 );       /* OOM detected prior to this routine */
  VdbeNoopComment((v, "begin IN expr"));
  eType = sqlite3FindInIndex(pParse, pExpr,
                             IN_INDEX_MEMBERSHIP | IN_INDEX_NOOP_OK,
                             destIfFalse==destIfNull ? 0 : &rRhsHasNull,
                             aiMap, &iTab);

  assert( pParse->nErr || nVector==1 || eType==IN_INDEX_EPH
       || eType==IN_INDEX_INDEX_ASC || eType==IN_INDEX_INDEX_DESC
  );
#ifdef SQLITE_DEBUG
  /* Confirm that aiMap[] contains nVector integer values between 0 and
  ** nVector-1. */
  for(i=0; i<nVector; i++){
    int j, cnt;
    for(cnt=j=0; j<nVector; j++) if( aiMap[j]==i ) cnt++;
    assert( cnt==1 );
  }
#endif

  /* Code the LHS, the <expr> from "<expr> IN (...)". If the LHS is a
  ** vector, then it is stored in an array of nVector registers starting
  ** at r1.
  **
  ** sqlite3FindInIndex() might have reordered the fields of the LHS vector
  ** so that the fields are in the same order as an existing index.   The
  ** aiMap[] array contains a mapping from the original LHS field order to
  ** the field order that matches the RHS index.
  **
  ** Avoid factoring the LHS of the IN(...) expression out of the loop,
  ** even if it is constant, as OP_Affinity may be used on the register
  ** by code generated below.  */
  assert( pParse->okConstFactor==okConstFactor );
  pParse->okConstFactor = 0;
  rLhsOrig = exprCodeVector(pParse, pLeft, &iDummy);
  pParse->okConstFactor = okConstFactor;
  for(i=0; i<nVector && aiMap[i]==i; i++){} /* Are LHS fields reordered? */
  if( i==nVector ){
    /* LHS fields are not reordered */
    rLhs = rLhsOrig;
  }else{
    /* Need to reorder the LHS fields according to aiMap */
    rLhs = sqlite3GetTempRange(pParse, nVector);
    for(i=0; i<nVector; i++){
      sqlite3VdbeAddOp3(v, OP_Copy, rLhsOrig+i, rLhs+aiMap[i], 0);
    }
  }

  /* If sqlite3FindInIndex() did not find or create an index that is
  ** suitable for evaluating the IN operator, then evaluate using a
  ** sequence of comparisons.
  **
  ** This is step (1) in the in-operator.md optimized algorithm.
  */
  if( eType==IN_INDEX_NOOP ){
    ExprList *pList;
    CollSeq *pColl;
    int labelOk = sqlite3VdbeMakeLabel(pParse);
    int r2, regToFree;
    int regCkNull = 0;
    int ii;
    assert( ExprUseXList(pExpr) );
    pList = pExpr->x.pList;
    pColl = sqlite3ExprCollSeq(pParse, pExpr->pLeft);
    if( destIfNull!=destIfFalse ){
      regCkNull = sqlite3GetTempReg(pParse);
      sqlite3VdbeAddOp3(v, OP_BitAnd, rLhs, rLhs, regCkNull);
    }
    for(ii=0; ii<pList->nExpr; ii++){
      r2 = sqlite3ExprCodeTemp(pParse, pList->a[ii].pExpr, &regToFree);
      if( regCkNull && sqlite3ExprCanBeNull(pList->a[ii].pExpr) ){
        sqlite3VdbeAddOp3(v, OP_BitAnd, regCkNull, r2, regCkNull);
      }
      sqlite3ReleaseTempReg(pParse, regToFree);
      if( ii<pList->nExpr-1 || destIfNull!=destIfFalse ){
        int op = rLhs!=r2 ? OP_Eq : OP_NotNull;
        sqlite3VdbeAddOp4(v, op, rLhs, labelOk, r2,
                          (void*)pColl, P4_COLLSEQ);
        VdbeCoverageIf(v, ii<pList->nExpr-1 && op==OP_Eq);
        VdbeCoverageIf(v, ii==pList->nExpr-1 && op==OP_Eq);
        VdbeCoverageIf(v, ii<pList->nExpr-1 && op==OP_NotNull);
        VdbeCoverageIf(v, ii==pList->nExpr-1 && op==OP_NotNull);
        sqlite3VdbeChangeP5(v, zAff[0]);
      }else{
        int op = rLhs!=r2 ? OP_Ne : OP_IsNull;
        assert( destIfNull==destIfFalse );
        sqlite3VdbeAddOp4(v, op, rLhs, destIfFalse, r2,
                          (void*)pColl, P4_COLLSEQ);
        VdbeCoverageIf(v, op==OP_Ne);
        VdbeCoverageIf(v, op==OP_IsNull);
        sqlite3VdbeChangeP5(v, zAff[0] | SQLITE_JUMPIFNULL);
      }
    }
    if( regCkNull ){
      sqlite3VdbeAddOp2(v, OP_IsNull, regCkNull, destIfNull); VdbeCoverage(v);
      sqlite3VdbeGoto(v, destIfFalse);
    }
    sqlite3VdbeResolveLabel(v, labelOk);
    sqlite3ReleaseTempReg(pParse, regCkNull);
    goto sqlite3ExprCodeIN_finished;
  }

  /* Step 2: Check to see if the LHS contains any NULL columns.  If the
  ** LHS does contain NULLs then the result must be either FALSE or NULL.
  ** We will then skip the binary search of the RHS.
  */
  if( destIfNull==destIfFalse ){
    destStep2 = destIfFalse;
  }else{
    destStep2 = destStep6 = sqlite3VdbeMakeLabel(pParse);
  }
  for(i=0; i<nVector; i++){
    Expr *p = sqlite3VectorFieldSubexpr(pExpr->pLeft, i);
    if( pParse->nErr ) goto sqlite3ExprCodeIN_oom_error;
    if( sqlite3ExprCanBeNull(p) ){
      sqlite3VdbeAddOp2(v, OP_IsNull, rLhs+i, destStep2);
      VdbeCoverage(v);
    }
  }

  /* Step 3.  The LHS is now known to be non-NULL.  Do the binary search
  ** of the RHS using the LHS as a probe.  If found, the result is
  ** true.
  */
  if( eType==IN_INDEX_ROWID ){
    /* In this case, the RHS is the ROWID of table b-tree and so we also
    ** know that the RHS is non-NULL.  Hence, we combine steps 3 and 4
    ** into a single opcode. */
    sqlite3VdbeAddOp3(v, OP_SeekRowid, iTab, destIfFalse, rLhs);
    VdbeCoverage(v);
    addrTruthOp = sqlite3VdbeAddOp0(v, OP_Goto);  /* Return True */
  }else{
    sqlite3VdbeAddOp4(v, OP_Affinity, rLhs, nVector, 0, zAff, nVector);
    if( destIfFalse==destIfNull ){
      /* Combine Step 3 and Step 5 into a single opcode */
      sqlite3VdbeAddOp4Int(v, OP_NotFound, iTab, destIfFalse,
                           rLhs, nVector); VdbeCoverage(v);
      goto sqlite3ExprCodeIN_finished;
    }
    /* Ordinary Step 3, for the case where FALSE and NULL are distinct */
    addrTruthOp = sqlite3VdbeAddOp4Int(v, OP_Found, iTab, 0,
                                      rLhs, nVector); VdbeCoverage(v);
  }

  /* Step 4.  If the RHS is known to be non-NULL and we did not find
  ** an match on the search above, then the result must be FALSE.
  */
  if( rRhsHasNull && nVector==1 ){
    sqlite3VdbeAddOp2(v, OP_NotNull, rRhsHasNull, destIfFalse);
    VdbeCoverage(v);
  }

  /* Step 5.  If we do not care about the difference between NULL and
  ** FALSE, then just return false.
  */
  if( destIfFalse==destIfNull ) sqlite3VdbeGoto(v, destIfFalse);

  /* Step 6: Loop through rows of the RHS.  Compare each row to the LHS.
  ** If any comparison is NULL, then the result is NULL.  If all
  ** comparisons are FALSE then the final result is FALSE.
  **
  ** For a scalar LHS, it is sufficient to check just the first row
  ** of the RHS.
  */
  if( destStep6 ) sqlite3VdbeResolveLabel(v, destStep6);
  addrTop = sqlite3VdbeAddOp2(v, OP_Rewind, iTab, destIfFalse);
  VdbeCoverage(v);
  if( nVector>1 ){
    destNotNull = sqlite3VdbeMakeLabel(pParse);
  }else{
    /* For nVector==1, combine steps 6 and 7 by immediately returning
    ** FALSE if the first comparison is not NULL */
    destNotNull = destIfFalse;
  }
  for(i=0; i<nVector; i++){
    Expr *p;
    CollSeq *pColl;
    int r3 = sqlite3GetTempReg(pParse);
    p = sqlite3VectorFieldSubexpr(pLeft, i);
    pColl = sqlite3ExprCollSeq(pParse, p);
    sqlite3VdbeAddOp3(v, OP_Column, iTab, i, r3);
    sqlite3VdbeAddOp4(v, OP_Ne, rLhs+i, destNotNull, r3,
                      (void*)pColl, P4_COLLSEQ);
    VdbeCoverage(v);
    sqlite3ReleaseTempReg(pParse, r3);
  }
  sqlite3VdbeAddOp2(v, OP_Goto, 0, destIfNull);
  if( nVector>1 ){
    sqlite3VdbeResolveLabel(v, destNotNull);
    sqlite3VdbeAddOp2(v, OP_Next, iTab, addrTop+1);
    VdbeCoverage(v);

    /* Step 7:  If we reach this point, we know that the result must
    ** be false. */
    sqlite3VdbeAddOp2(v, OP_Goto, 0, destIfFalse);
  }

  /* Jumps here in order to return true. */
  sqlite3VdbeJumpHere(v, addrTruthOp);

sqlite3ExprCodeIN_finished:
  if( rLhs!=rLhsOrig ) sqlite3ReleaseTempReg(pParse, rLhs);
  VdbeComment((v, "end IN expr"));
sqlite3ExprCodeIN_oom_error:
  sqlite3DbFree(pParse->db, aiMap);
  sqlite3DbFree(pParse->db, zAff);
}